

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O1

void __thiscall fasttext::FastText::loadModel(FastText *this,istream *in)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  Model *this_00;
  pointer plVar2;
  pointer plVar3;
  undefined4 local_50;
  undefined1 local_49;
  vector<long,_std::allocator<long>_> local_48;
  
  local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<fasttext::Args,std::allocator<fasttext::Args>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish,(Args **)&local_48,
             (allocator<fasttext::Args> *)&local_50);
  plVar3 = local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  plVar2 = local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_start;
  local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  p_Var1 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)plVar2;
  (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<fasttext::Dictionary,std::allocator<fasttext::Dictionary>,std::shared_ptr<fasttext::Args>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish,(Dictionary **)&local_48,
             (allocator<fasttext::Dictionary> *)&local_50,&this->args_);
  plVar3 = local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  plVar2 = local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_start;
  local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  p_Var1 = (this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)plVar2;
  (this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<fasttext::Matrix,std::allocator<fasttext::Matrix>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish,(Matrix **)&local_48,
             (allocator<fasttext::Matrix> *)&local_50);
  plVar3 = local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  plVar2 = local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_start;
  local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  p_Var1 = (this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)plVar2;
  (this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<fasttext::Matrix,std::allocator<fasttext::Matrix>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish,(Matrix **)&local_48,
             (allocator<fasttext::Matrix> *)&local_50);
  plVar3 = local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  plVar2 = local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_start;
  local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  p_Var1 = (this->output_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->output_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)plVar2;
  (this->output_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  Args::load((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr,in)
  ;
  Dictionary::load((this->dict_).
                   super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>._M_ptr,in);
  Matrix::load((this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,in);
  Matrix::load((this->output_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,in);
  local_50 = 0;
  local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<fasttext::Model,std::allocator<fasttext::Model>,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Args>&,int>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish,(Model **)&local_48,
             (allocator<fasttext::Model> *)&local_49,&this->input_,&this->output_,&this->args_,
             (int *)&local_50);
  plVar3 = local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  plVar2 = local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_start;
  local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  p_Var1 = (this->model_).super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->model_).super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)plVar2;
  (this->model_).super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  this_00 = (this->model_).super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->model
      == sup) {
    Dictionary::getCounts
              (&local_48,
               (this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,label);
    Model::setTargetCounts(this_00,&local_48);
  }
  else {
    Dictionary::getCounts
              (&local_48,
               (this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,word);
    Model::setTargetCounts(this_00,&local_48);
  }
  if (local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void FastText::loadModel(std::istream& in) {
  args_ = std::make_shared<Args>();
  dict_ = std::make_shared<Dictionary>(args_);
  input_ = std::make_shared<Matrix>();
  output_ = std::make_shared<Matrix>();
  args_->load(in);
  dict_->load(in);
  input_->load(in);
  output_->load(in);
  model_ = std::make_shared<Model>(input_, output_, args_, 0);
  if (args_->model == model_name::sup) {
    model_->setTargetCounts(dict_->getCounts(entry_type::label));
  } else {
    model_->setTargetCounts(dict_->getCounts(entry_type::word));
  }
}